

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int SUNLogger_Create(void *comm,int output_rank,SUNLogger *logger_ptr)

{
  int iVar1;
  SUNLogger logger_00;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  SUNLogger logger;
  int local_4;
  
  logger_00 = (SUNLogger)malloc(0x60);
  *in_RDX = logger_00;
  if (logger_00 == (SUNLogger)0x0) {
    local_4 = -1;
  }
  else if (in_RDI == 0) {
    logger_00->commptr = (void *)0x0;
    logger_00->output_rank = in_ESI;
    logger_00->content = (void *)0x0;
    logger_00->queuemsg =
         (_func_int_SUNLogger_SUNLogLevel_char_ptr_char_ptr_char_ptr___va_list_tag_ptr *)0x0;
    logger_00->flush = (_func_int_SUNLogger_SUNLogLevel *)0x0;
    logger_00->destroy = (_func_int_SUNLogger_ptr *)0x0;
    logger_00->filenames = (SUNHashMap)0x0;
    logger_00->error_fp = (FILE *)0x0;
    logger_00->warning_fp = (FILE *)0x0;
    logger_00->debug_fp = (FILE *)0x0;
    logger_00->info_fp = (FILE *)0x0;
    iVar1 = sunLoggerIsOutputRank(logger_00,(int *)0x0);
    if (iVar1 != 0) {
      SUNHashMap_New((int)in_RDX,(SUNHashMap *)logger_00);
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int SUNLogger_Create(void* comm, int output_rank, SUNLogger* logger_ptr)
{
  SUNLogger logger = NULL;

  *logger_ptr = logger = (SUNLogger)malloc(sizeof(struct SUNLogger_));
  if (logger == NULL)
  {
    return -1;
  }

  /* Attach the comm, duplicating it if MPI is used. */
#ifdef SUNDIALS_LOGGING_ENABLE_MPI
  logger->commptr = NULL;
  if (comm != NULL)
  {
    logger->commptr = malloc(sizeof(MPI_Comm));
    MPI_Comm_dup(*((MPI_Comm*) comm), (MPI_Comm*) logger->commptr);
  }
#else
  if (comm != NULL)
  {
    return -1;
  }
  logger->commptr = NULL;
#endif
  logger->output_rank = output_rank;
  logger->content     = NULL;

  /* use default routines */
  logger->queuemsg = NULL;
  logger->flush    = NULL;
  logger->destroy  = NULL;

  /* set the output file handles */
  logger->filenames  = NULL;
  logger->error_fp   = NULL;
  logger->warning_fp = NULL;
  logger->debug_fp   = NULL;
  logger->info_fp    = NULL;
  if (sunLoggerIsOutputRank(logger, NULL))
  {
    /* We store the FILE* in a hash map so that we can ensure
       that we do not open a file twice if the same file is used
       for multiple output levels */
    SUNHashMap_New(SUN_MAX_LOGFILE_HANDLES_, &logger->filenames);
  }

  return 0;
}